

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_convolver.hpp
# Opt level: O0

void __thiscall ear::dsp::block_convolver::Filter::~Filter(Filter *this)

{
  Filter *this_local;
  
  std::shared_ptr<ear::dsp::block_convolver_impl::Filter>::~shared_ptr(&this->impl);
  return;
}

Assistant:

class EAR_EXPORT Filter {
       public:
        Filter(const Context &ctx, size_t n, const real_t *filter);

        /** The number of blocks in the filter. */
        size_t num_blocks() const;

       private:
        std::shared_ptr<block_convolver_impl::Filter> impl;
        friend class BlockConvolver;
      }